

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_encrypt_address_token
              (_func_void_void_ptr_size_t *random_bytes,ptls_aead_context_t *aead,ptls_buffer_t *buf
              ,size_t start_off,quicly_address_token_plaintext_t *plaintext)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ptls_buffer_t *in_RDX;
  long *in_RSI;
  code *in_RDI;
  int *in_R8;
  size_t body_size_5;
  size_t body_start_5;
  size_t capacity_5;
  size_t body_size_4;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint16_t _v_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  uint16_t port;
  uint64_t _v;
  size_t enc_start;
  int ret;
  size_t in_stack_fffffffffffffea8;
  void *in_stack_fffffffffffffeb0;
  void *src;
  ptls_buffer_t *in_stack_fffffffffffffeb8;
  ptls_buffer_t *buf_00;
  uint64_t in_stack_fffffffffffffec0;
  ptls_buffer_t *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  ptls_buffer_t *in_stack_fffffffffffffed8;
  ptls_aead_context_t *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffef0;
  long local_d8;
  long local_c0;
  long local_a8;
  long local_90;
  long local_78;
  long local_58;
  int local_2c;
  
  local_2c = ptls_buffer_reserve(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
  if (local_2c == 0) {
    iVar4 = *in_R8;
    sVar1 = in_RDX->off;
    in_RDX->off = sVar1 + 1;
    in_RDX->base[sVar1] = (uint8_t)iVar4;
    (*in_RDI)(in_RDX->base + in_RDX->off,*(undefined8 *)(*in_RSI + 0x30));
    in_RDX->off = *(long *)(*in_RSI + 0x30) + in_RDX->off;
    sVar1 = in_RDX->off;
    local_2c = ptls_buffer__do_pushv
                         (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                          in_stack_fffffffffffffea8);
    if (local_2c == 0) {
      local_58 = 1;
      local_2c = ptls_buffer__do_pushv
                           (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                            in_stack_fffffffffffffea8);
      if (local_2c == 0) {
        sVar2 = in_RDX->off;
        if ((short)in_R8[0xb] == 2) {
          iVar4 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                             in_stack_fffffffffffffea8);
          if (iVar4 != 0) {
            return iVar4;
          }
          ntohs(*(uint16_t *)((long)in_R8 + 0x2e));
        }
        else {
          if ((short)in_R8[0xb] != 10) {
            __assert_fail("!\"unspported address type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0x17d4,
                          "int quicly_encrypt_address_token(void (*)(void *, size_t), ptls_aead_context_t *, ptls_buffer_t *, size_t, const quicly_address_token_plaintext_t *)"
                         );
          }
          iVar4 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                             in_stack_fffffffffffffea8);
          if (iVar4 != 0) {
            return iVar4;
          }
          ntohs(*(uint16_t *)((long)in_R8 + 0x2e));
        }
        sVar3 = in_RDX->off;
        for (; local_58 != 0; local_58 = local_58 + -1) {
          in_RDX->base[sVar2 - local_58] =
               (uint8_t)(sVar3 - sVar2 >> (((char)local_58 + -1) * '\b' & 0x3fU));
        }
        local_2c = ptls_buffer__do_pushv
                             (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                              in_stack_fffffffffffffea8);
        if (local_2c == 0) {
          if (*in_R8 == 0) {
            local_78 = 1;
            in_stack_fffffffffffffef0 = 1;
            iVar4 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffea8);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar2 = in_RDX->off;
            iVar4 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffea8);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar3 = in_RDX->off;
            for (; local_78 != 0; local_78 = local_78 + -1) {
              in_RDX->base[sVar2 - local_78] =
                   (uint8_t)(sVar3 - sVar2 >> (((char)local_78 + -1) * '\b' & 0x3fU));
            }
            local_90 = 1;
            in_stack_fffffffffffffee0 = (ptls_aead_context_t *)0x1;
            iVar4 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffea8);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar2 = in_RDX->off;
            iVar4 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffea8);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar3 = in_RDX->off;
            for (; local_90 != 0; local_90 = local_90 + -1) {
              in_RDX->base[sVar2 - local_90] =
                   (uint8_t)(sVar3 - sVar2 >> (((char)local_90 + -1) * '\b' & 0x3fU));
            }
            local_a8 = 1;
            in_stack_fffffffffffffed0 = (void *)0x1;
            in_stack_fffffffffffffed8 = in_RDX;
            iVar4 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffea8);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar2 = in_RDX->off;
            iVar4 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffea8);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar3 = in_RDX->off;
            for (; local_a8 != 0; local_a8 = local_a8 + -1) {
              in_RDX->base[sVar2 - local_a8] =
                   (uint8_t)(sVar3 - sVar2 >> (((char)local_a8 + -1) * '\b' & 0x3fU));
            }
          }
          else {
            if (*in_R8 != 1) {
              __assert_fail("!\"unexpected token type\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0x17e7,
                            "int quicly_encrypt_address_token(void (*)(void *, size_t), ptls_aead_context_t *, ptls_buffer_t *, size_t, const quicly_address_token_plaintext_t *)"
                           );
            }
            local_c0 = 1;
            in_stack_fffffffffffffec0 = 1;
            in_stack_fffffffffffffec8 = in_RDX;
            iVar4 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffea8);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar2 = in_RDX->off;
            iVar4 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               in_stack_fffffffffffffea8);
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar3 = in_RDX->off;
            for (; local_c0 != 0; local_c0 = local_c0 + -1) {
              in_RDX->base[sVar2 - local_c0] =
                   (uint8_t)(sVar3 - sVar2 >> (((char)local_c0 + -1) * '\b' & 0x3fU));
            }
          }
          local_d8 = 1;
          src = (void *)0x1;
          buf_00 = in_RDX;
          local_2c = ptls_buffer__do_pushv(in_RDX,(void *)0x1,in_stack_fffffffffffffea8);
          if (local_2c == 0) {
            sVar2 = in_RDX->off;
            local_2c = ptls_buffer__do_pushv(buf_00,src,in_stack_fffffffffffffea8);
            if (local_2c == 0) {
              sVar3 = in_RDX->off;
              for (; local_d8 != 0; local_d8 = local_d8 + -1) {
                in_RDX->base[sVar2 - local_d8] =
                     (uint8_t)(sVar3 - sVar2 >> (((char)local_d8 + -1) * '\b' & 0x3fU));
              }
              local_2c = ptls_buffer_reserve(buf_00,(size_t)src);
              if (local_2c == 0) {
                (**(code **)(*in_RSI + 0x48))
                          (in_RSI,1,0,in_RDX->base + (sVar1 - *(long *)(*in_RSI + 0x30)));
                ptls_aead_encrypt(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                  in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,
                                  in_stack_fffffffffffffec0,buf_00,in_stack_fffffffffffffef0);
                in_RDX->off = *(long *)(*in_RSI + 0x38) + in_RDX->off;
              }
            }
          }
        }
      }
    }
  }
  return local_2c;
}

Assistant:

int quicly_encrypt_address_token(void (*random_bytes)(void *, size_t), ptls_aead_context_t *aead, ptls_buffer_t *buf,
                                 size_t start_off, const quicly_address_token_plaintext_t *plaintext)
{
    int ret;

    /* type and IV */
    if ((ret = ptls_buffer_reserve(buf, 1 + aead->algo->iv_size)) != 0)
        goto Exit;
    buf->base[buf->off++] = plaintext->type;
    random_bytes(buf->base + buf->off, aead->algo->iv_size);
    buf->off += aead->algo->iv_size;

    size_t enc_start = buf->off;

    /* data */
    ptls_buffer_push64(buf, plaintext->issued_at);
    {
        uint16_t port;
        ptls_buffer_push_block(buf, 1, {
            switch (plaintext->remote.sa.sa_family) {
            case AF_INET:
                ptls_buffer_pushv(buf, &plaintext->remote.sin.sin_addr.s_addr, 4);
                port = ntohs(plaintext->remote.sin.sin_port);
                break;
            case AF_INET6:
                ptls_buffer_pushv(buf, &plaintext->remote.sin6.sin6_addr, 16);
                port = ntohs(plaintext->remote.sin6.sin6_port);
                break;
            default:
                assert(!"unspported address type");
                break;
            }
        });
        ptls_buffer_push16(buf, port);
    }
    switch (plaintext->type) {
    case QUICLY_ADDRESS_TOKEN_TYPE_RETRY:
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, plaintext->retry.original_dcid.cid, plaintext->retry.original_dcid.len); });
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, plaintext->retry.client_cid.cid, plaintext->retry.client_cid.len); });
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, plaintext->retry.server_cid.cid, plaintext->retry.server_cid.len); });
        break;
    case QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION:
        ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, plaintext->resumption.bytes, plaintext->resumption.len); });
        break;
    default:
        assert(!"unexpected token type");
        abort();
    }
    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, plaintext->appdata.bytes, plaintext->appdata.len); });

    /* encrypt, abusing the internal API to supply full IV */
    if ((ret = ptls_buffer_reserve(buf, aead->algo->tag_size)) != 0)
        goto Exit;
    aead->algo->setup_crypto(aead, 1, NULL, buf->base + enc_start - aead->algo->iv_size);
    ptls_aead_encrypt(aead, buf->base + enc_start, buf->base + enc_start, buf->off - enc_start, 0, buf->base + start_off,
                      enc_start - start_off);
    buf->off += aead->algo->tag_size;

Exit:
    return ret;
}